

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O0

FaceInfo * __thiscall Ptex::v2_2::PtexReader::getFaceInfo(PtexReader *this,int faceid)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  uint in_ESI;
  FaceInfo *in_RDI;
  
  if ((-1 < (int)in_ESI) &&
     (sVar2 = std::vector<Ptex::v2_2::FaceInfo,_std::allocator<Ptex::v2_2::FaceInfo>_>::size
                        ((vector<Ptex::v2_2::FaceInfo,_std::allocator<Ptex::v2_2::FaceInfo>_> *)
                         (in_RDI[0x10].adjfaces + 3)), in_ESI < sVar2)) {
    pvVar3 = std::vector<Ptex::v2_2::FaceInfo,_std::allocator<Ptex::v2_2::FaceInfo>_>::operator[]
                       ((vector<Ptex::v2_2::FaceInfo,_std::allocator<Ptex::v2_2::FaceInfo>_> *)
                        (in_RDI[0x10].adjfaces + 3),(long)(int)in_ESI);
    return pvVar3;
  }
  if ((getFaceInfo(int)::dummy == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getFaceInfo(int)::dummy), iVar1 != 0)) {
    FaceInfo::FaceInfo(in_RDI);
    __cxa_guard_release(&getFaceInfo(int)::dummy);
  }
  return &getFaceInfo::dummy;
}

Assistant:

const Ptex::FaceInfo& PtexReader::getFaceInfo(int faceid)
{
    if (faceid >= 0 && uint32_t(faceid) < _faceinfo.size())
        return _faceinfo[faceid];

    static Ptex::FaceInfo dummy;
    return dummy;
}